

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_object.cpp
# Opt level: O2

Variable __thiscall
LiteScript::_Type_CLASS_OBJECT::OAddAndAssign
          (_Type_CLASS_OBJECT *this,Variable *object_target,Variable *object_src)

{
  State *state;
  bool bVar1;
  Object *pOVar2;
  Type *this_00;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar3;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> args;
  Variable local_48;
  Variable v;
  
  pOVar2 = Variable::operator->(object_src);
  Class::GetOperator((Class *)&v,(OperatorType)*(undefined8 *)((long)pOVar2->data + 0x38));
  pOVar2 = Variable::operator->(&v);
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator==(this_00,(Type *)_type_callback);
  if (bVar1) {
    pOVar2 = Variable::operator->(object_src);
    if (*(long *)((long)pOVar2->data + 0x40) != 0) {
      pOVar2 = Variable::operator->(&v);
      state = (State *)pOVar2->data;
      Nullable<LiteScript::Variable>::Nullable((Nullable<LiteScript::Variable> *)&args,object_src);
      Nullable<LiteScript::Variable>::operator=
                ((Nullable<LiteScript::Variable> *)&state->nsp_global,
                 (Nullable<LiteScript::Variable> *)&args);
      Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)&args);
      args.super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      args.super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      args.super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Variable::Variable(&local_48,in_RCX);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
      emplace_back<LiteScript::Variable>(&args,&local_48);
      Variable::~Variable(&local_48);
      pOVar2 = Variable::operator->(object_src);
      Callback::operator()
                ((Callback *)this,state,
                 *(vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> **)
                  ((long)pOVar2->data + 0x40));
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector(&args);
      goto LAB_0012ac4d;
    }
  }
  pOVar2 = Variable::operator->(object_src);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
LAB_0012ac4d:
  Variable::~Variable(&v);
  VVar3.nb_ref = extraout_RDX;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CLASS_OBJECT::OAddAndAssign(Variable& object_target, const Variable& object_src) const {
    Variable v = object_target->GetData<ClassObject>().ClassBase->GetOperator(Class::OperatorType::OP_TYPE_ADD_ASSIGN);
    if (v->GetType() == Type::CALLBACK) {
        if (object_target->GetData<ClassObject>().ScriptState == nullptr)
            return object_target->memory.Create(Type::NIL);
        Callback &call = v->GetData<Callback>();
        call.This = Nullable<Variable>(object_target);
        std::vector<Variable> args;
        args.push_back(Variable(object_src));
        return call(*(object_target->GetData<ClassObject>().ScriptState), args);
    }
    else {
        return object_target->memory.Create(Type::NIL);
    }
}